

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::json_string_to_utf8(utf8 *this,string *src)

{
  size_type sVar1;
  byte c;
  string *dst;
  size_t sVar2;
  json_utf8_exception *this_00;
  pointer *__ptr;
  char cVar3;
  size_t dst_index;
  size_t local_40;
  ulong local_38;
  
  local_40 = 0;
  dst = (string *)operator_new(0x20);
  sVar1 = src->_M_string_length;
  (dst->_M_dataplus)._M_p = (pointer)&dst->field_2;
  std::__cxx11::string::_M_construct((ulong)dst,(char)sVar1);
  *(string **)this = dst;
  if (src->_M_string_length == 0) {
    cVar3 = '\0';
  }
  else {
    local_38 = 0;
    do {
      c = (src->_M_dataplus)._M_p[local_38];
      local_38 = local_38 + 1;
      if (c != 0x5c) {
LAB_0011cbca:
        sVar2 = local_40;
        local_40 = local_40 + 1;
        goto LAB_0011cbd8;
      }
      c = next_char(src,&local_38);
      if (c < 0x62) {
        if (((c != 0x22) && (c != 0x2f)) && (c != 0x5c)) goto switchD_0011cbff_caseD_6f;
        goto LAB_0011cbca;
      }
      sVar2 = local_40;
      switch(c) {
      case 0x6e:
        c = 10;
        local_40 = local_40 + 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0011cbff_caseD_6f:
        this_00 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
        json_utf8_exception::json_utf8_exception(this_00,invalid_string_escape_e,c);
        __cxa_throw(this_00,&json_utf8_exception::typeinfo,std::exception::~exception);
      case 0x72:
        c = 0xd;
        local_40 = local_40 + 1;
        break;
      case 0x74:
        c = 9;
        local_40 = local_40 + 1;
        break;
      case 0x75:
        parse_unicode(src,&local_38,dst,&local_40);
        goto LAB_0011cbdf;
      default:
        if (c == 0x62) {
          c = 8;
          local_40 = local_40 + 1;
        }
        else {
          if (c != 0x66) goto switchD_0011cbff_caseD_6f;
          c = 0xc;
          local_40 = local_40 + 1;
        }
      }
LAB_0011cbd8:
      (dst->_M_dataplus)._M_p[sVar2] = c;
LAB_0011cbdf:
    } while (local_38 < src->_M_string_length);
    cVar3 = (char)local_40;
  }
  std::__cxx11::string::resize((ulong)dst,cVar3);
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<string> utf8::json_string_to_utf8(const string &src)
{
    size_t src_index = 0;
    size_t dst_index = 0;

    string *dst = new string(src.size(), '\0');

    unique_ptr<string> res(dst);

    while (src_index < src.size())
    {
        if (src[src_index] != '\\')
        {
            (*dst)[dst_index++] = src[src_index++];
        }
        else
        {
            char c = next_char(src, ++src_index);

            switch (c)
            {
            case '"':
            case '\\':
            case '/':
                (*dst)[dst_index++] = c;
                break;
            case 'b':
                (*dst)[dst_index++] = '\b';
                break;
            case 'f':
                (*dst)[dst_index++] = '\f';
                break;
            case 'n':
                (*dst)[dst_index++] = '\n';
                break;
            case 'r':
                (*dst)[dst_index++] = '\r';
                break;
            case 't':
                (*dst)[dst_index++] = '\t';
                break;
            case 'u':
                parse_unicode(src, src_index, *dst, dst_index);
                break;
            default: 
                throw json_utf8_exception(json_utf8_exception::invalid_string_escape_e, c);
            }
        }
    }

    dst->resize(dst_index);
    return res;
}